

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_init(connectdata *conn)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  IMAP *imap;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pCVar1 = conn->data;
  pvVar2 = (*Curl_ccalloc)(0x50,1);
  (pCVar1->req).protop = pvVar2;
  if (pvVar2 == (void *)0x0) {
    data._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_init(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap;

  imap = data->req.protop = calloc(sizeof(struct IMAP), 1);
  if(!imap)
    result = CURLE_OUT_OF_MEMORY;

  return result;
}